

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

TokenOrSyntax * __thiscall
slang::syntax::SequenceDeclarationSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,SequenceDeclarationSyntax *this,size_t index)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  AssertionItemPortListSyntax *pAVar2;
  Token local_20;
  
  switch(index) {
  case 0:
    pSVar1 = &(this->super_MemberSyntax).attributes;
    goto LAB_002ee028;
  case 1:
    local_20.kind = (this->keyword).kind;
    local_20._2_1_ = (this->keyword).field_0x2;
    local_20.numFlags.raw = (this->keyword).numFlags.raw;
    local_20.rawLen = (this->keyword).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->keyword).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->keyword).info + 4);
    break;
  case 2:
    local_20.kind = (this->name).kind;
    local_20._2_1_ = (this->name).field_0x2;
    local_20.numFlags.raw = (this->name).numFlags.raw;
    local_20.rawLen = (this->name).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->name).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->name).info + 4);
    break;
  case 3:
    pAVar2 = this->portList;
    goto LAB_002ee039;
  case 4:
    local_20.kind = (this->semi).kind;
    local_20._2_1_ = (this->semi).field_0x2;
    local_20.numFlags.raw = (this->semi).numFlags.raw;
    local_20.rawLen = (this->semi).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->semi).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->semi).info + 4);
    break;
  case 5:
    pSVar1 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             &(this->variables).super_SyntaxListBase;
LAB_002ee028:
    *(SyntaxNode **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(pSVar1->super_SyntaxListBase).super_SyntaxNode;
    goto LAB_002ee03c;
  case 6:
    pAVar2 = (AssertionItemPortListSyntax *)(this->seqExpr).ptr;
    if (pAVar2 == (AssertionItemPortListSyntax *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<slang::syntax::SequenceExprSyntax *>::get() const [T = slang::syntax::SequenceExprSyntax *]"
                );
    }
    goto LAB_002ee039;
  case 7:
    local_20.kind = (this->optionalSemi).kind;
    local_20._2_1_ = (this->optionalSemi).field_0x2;
    local_20.numFlags.raw = (this->optionalSemi).numFlags.raw;
    local_20.rawLen = (this->optionalSemi).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->optionalSemi).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->optionalSemi).info + 4);
    break;
  case 8:
    local_20.kind = (this->end).kind;
    local_20._2_1_ = (this->end).field_0x2;
    local_20.numFlags.raw = (this->end).numFlags.raw;
    local_20.rawLen = (this->end).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->end).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->end).info + 4);
    break;
  case 9:
    pAVar2 = (AssertionItemPortListSyntax *)this->endBlockName;
LAB_002ee039:
    *(AssertionItemPortListSyntax **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pAVar2;
LAB_002ee03c:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10
     ) = '\x01';
    return __return_storage_ptr__;
  default:
    parsing::Token::Token(&local_20);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_ConstTokenOrSyntax).
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
       local_20._0_4_;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 4) =
       local_20.rawLen;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 8) =
       local_20.info._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0xc) =
       local_20.info._4_4_;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\0';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax SequenceDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return name;
        case 3: return portList;
        case 4: return semi;
        case 5: return &variables;
        case 6: return seqExpr.get();
        case 7: return optionalSemi;
        case 8: return end;
        case 9: return endBlockName;
        default: return nullptr;
    }
}